

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  uint local_5c;
  int nMaxIters;
  int c;
  int fVerbose;
  int fFastAlgo;
  int nStepsMax;
  int fInitial;
  int fBackwardOnly;
  int fForwardOnly;
  int fMinArea;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = true;
  fInitial = 0;
  nStepsMax = 0;
  fFastAlgo = 1;
  fVerbose = 100000;
  bVar2 = false;
  local_5c = 0x14;
  nMaxIters = 0;
  Extra_UtilGetoptReset();
LAB_0028780f:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"NSmfbiavh");
    if (iVar3 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar3 = Abc_NtkLatchNum(pNtk_00);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = Abc_NtkIsStrash(pNtk_00);
      if (iVar3 == 0) {
        Abc_Print(-1,"This command works only for structrally hashed networks. Run \"st\".\n");
        return 0;
      }
      if (bVar1) {
        _fForwardOnly =
             Abc_NtkDarRetimeMinArea(pNtk_00,local_5c,fInitial,nStepsMax,fFastAlgo,nMaxIters);
      }
      else if (bVar2) {
        _fForwardOnly = Abc_NtkDarRetime(pNtk_00,fVerbose,nMaxIters);
      }
      else {
        _fForwardOnly = Abc_NtkDarRetimeMostFwd(pNtk_00,local_5c,nMaxIters);
      }
      if (_fForwardOnly == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Retiming has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,_fForwardOnly);
      return 0;
    }
    switch(iVar3) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by a positive integer.\n");
        goto LAB_00287a71;
      }
      local_5c = atoi(argv[globalUtilOptind]);
      uVar4 = local_5c;
      break;
    default:
      goto LAB_00287a71;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a positive integer.\n");
        goto LAB_00287a71;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      uVar4 = fVerbose;
      break;
    case 0x61:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0028780f;
    case 0x62:
      nStepsMax = nStepsMax ^ 1;
      goto LAB_0028780f;
    case 0x66:
      fInitial = fInitial ^ 1;
      goto LAB_0028780f;
    case 0x68:
      goto LAB_00287a71;
    case 0x69:
      fFastAlgo = fFastAlgo ^ 1;
      goto LAB_0028780f;
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0028780f;
    case 0x76:
      nMaxIters = nMaxIters ^ 1;
      goto LAB_0028780f;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar4 < 0) {
LAB_00287a71:
      Abc_Print(-2,"usage: dretime [-NS num] [-mfbiavh]\n");
      Abc_Print(-2,"\t         new implementation of min-area (or most-forward) retiming\n");
      pcVar5 = "most-fwd";
      if (bVar1) {
        pcVar5 = "min-area";
      }
      Abc_Print(-2,"\t-m     : toggle min-area retiming and most-forward retiming [default = %s]\n",
                pcVar5);
      pcVar5 = "no";
      if (fInitial != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-f     : enables forward-only retiming [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (nStepsMax != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-b     : enables backward-only retiming [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (fFastAlgo != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-i     : enables init state computation [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-N num : the max number of one-frame iterations to perform [default = %d]\n",
                (ulong)local_5c);
      Abc_Print(-2,"\t-S num : the max number of forward retiming steps to perform [default = %d]\n"
                ,(ulong)(uint)fVerbose);
      pcVar5 = "no";
      if (bVar2) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-a     : enables a fast most-forward algorithm [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (nMaxIters != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : enables verbose output [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fMinArea;
    int fForwardOnly;
    int fBackwardOnly;
    int fInitial;
    int nStepsMax;
    int fFastAlgo;
    int fVerbose;
    int c, nMaxIters;
    extern Abc_Ntk_t * Abc_NtkDarRetime( Abc_Ntk_t * pNtk, int nStepsMax, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarRetimeF( Abc_Ntk_t * pNtk, int nStepsMax, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarRetimeMinArea( Abc_Ntk_t * pNtk, int nMaxIters, int fForwardOnly, int fBackwardOnly, int fInitial, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarRetimeMostFwd( Abc_Ntk_t * pNtk, int nMaxIters, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fMinArea  = 1;
    fForwardOnly = 0;
    fBackwardOnly = 0;
    fInitial = 1;
    nStepsMax = 100000;
    fFastAlgo = 0;
    nMaxIters = 20;
    fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSmfbiavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nMaxIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxIters < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nStepsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStepsMax < 0 )
                goto usage;
            break;
        case 'm':
            fMinArea ^= 1;
            break;
        case 'f':
            fForwardOnly ^= 1;
            break;
        case 'b':
            fBackwardOnly ^= 1;
            break;
        case 'i':
            fInitial ^= 1;
            break;
        case 'a':
            fFastAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
//        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    // perform the retiming
    if ( fMinArea )
        pNtkRes = Abc_NtkDarRetimeMinArea( pNtk, nMaxIters, fForwardOnly, fBackwardOnly, fInitial, fVerbose );
    else if ( fFastAlgo )
        pNtkRes = Abc_NtkDarRetime( pNtk, nStepsMax, fVerbose );
    else
//        pNtkRes = Abc_NtkDarRetimeF( pNtk, nStepsMax, fVerbose );
        pNtkRes = Abc_NtkDarRetimeMostFwd( pNtk, nMaxIters, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Retiming has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dretime [-NS num] [-mfbiavh]\n" );
    Abc_Print( -2, "\t         new implementation of min-area (or most-forward) retiming\n" );
    Abc_Print( -2, "\t-m     : toggle min-area retiming and most-forward retiming [default = %s]\n", fMinArea? "min-area": "most-fwd" );
    Abc_Print( -2, "\t-f     : enables forward-only retiming [default = %s]\n", fForwardOnly? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming [default = %s]\n", fBackwardOnly? "yes": "no" );
    Abc_Print( -2, "\t-i     : enables init state computation [default = %s]\n", fInitial? "yes": "no" );
    Abc_Print( -2, "\t-N num : the max number of one-frame iterations to perform [default = %d]\n", nMaxIters );
    Abc_Print( -2, "\t-S num : the max number of forward retiming steps to perform [default = %d]\n", nStepsMax );
    Abc_Print( -2, "\t-a     : enables a fast most-forward algorithm [default = %s]\n", fFastAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}